

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O2

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall
VariationIndex::_containedIn(VariationIndex *this,int chromosome_id,size_t start,size_t end)

{
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>,_int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>_>_>
  *this_00;
  int iVar1;
  long lVar2;
  ulong uVar3;
  pointer __p;
  node_pointer ppVar4;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  iVar5;
  ulong uVar6;
  pointer pvVar7;
  node_pointer ppVar8;
  long lVar9;
  value_type_conflict3 *k;
  undefined4 in_register_00000034;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  ulong in_R8;
  emplace_return eVar10;
  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_70;
  int chromosome_id_local;
  unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  active_variations;
  
  chromosome_id_local = (int)start;
  this->_vptr_VariationIndex = (_func_int **)0x0;
  this_00 = (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>,_int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>_>_>
             *)(CONCAT44(in_register_00000034,chromosome_id) + 0x10);
  ppVar4 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>,_int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>_>_>
           ::find_node(this_00,&chromosome_id_local);
  if (ppVar4 != (node_pointer)0x0) {
    eVar10 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
             ::try_emplace_unique<int_const&>
                       ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                         *)this_00,&chromosome_id_local);
    iVar5 = eVar10.first.node_;
    uVar6 = (end - 1) / *(ulong *)(CONCAT44(in_register_00000034,chromosome_id) + 0x78);
    if (uVar6 < (ulong)(*(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 0x28) -
                        *(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 0x20) >> 5)) {
      boost::unordered::
      unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set(&active_variations);
      uVar6 = *(ulong *)(*(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 0x20) +
                        uVar6 * 0x20);
      lVar9 = uVar6 * 0x18 + 8;
      while( true ) {
        lVar2 = *(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 8);
        if ((ulong)((*(long *)((long)&((iVar5.node_)->value_base_).data_.data_ + 0x10) - lVar2) /
                   0x18) <= uVar6) break;
        uVar3 = *(ulong *)(lVar2 + -8 + lVar9);
        if (end <= uVar3) {
          if (in_R8 < uVar3) break;
          iVar1 = *(int *)(lVar2 + 8 + lVar9);
          if (iVar1 == 2) {
            k = (value_type_conflict3 *)(lVar2 + lVar9);
            ppVar8 = boost::unordered::detail::
                     table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
                     ::find_node(&active_variations.table_,k);
            if (ppVar8 != (node_pointer)0x0) {
              this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        this->_vptr_VariationIndex;
              if (this_01 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
                pvVar7 = (pointer)operator_new(0x18);
                (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_70._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        )0x0;
                std::
                __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)this,pvVar7);
                std::
                unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::~unique_ptr((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)&local_70);
                this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          this->_vptr_VariationIndex;
              }
LAB_00194305:
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_01,k);
            }
          }
          else if (iVar1 == 1) {
            boost::unordered::
            unordered_set<unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
            ::emplace<unsigned_long_const&>(&active_variations,(unsigned_long *)(lVar2 + lVar9));
          }
          else if (iVar1 == 0) {
            this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      this->_vptr_VariationIndex;
            if (this_01 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
              pvVar7 = (pointer)operator_new(0x18);
              (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_70._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      )0x0;
              std::
              __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)this,pvVar7);
              std::
              unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::~unique_ptr((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)&local_70);
              this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        this->_vptr_VariationIndex;
            }
            k = (value_type_conflict3 *)(lVar2 + uVar6 * 0x18 + 8);
            goto LAB_00194305;
          }
        }
        uVar6 = uVar6 + 1;
        lVar9 = lVar9 + 0x18;
      }
      boost::unordered::detail::
      table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
      ::~table(&active_variations.table_);
    }
  }
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<size_t> > VariationIndex::_containedIn(int chromosome_id, size_t start, size_t end) {
	unique_ptr<vector<size_t> > result(nullptr);
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return result;
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (start-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return result;
	}
	const vector<event_t>& event_list = chromosome_record.events;
	boost::unordered_set<size_t> active_variations;
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position < start) continue;
		if (event.position > end) break;
		switch (event.type) {
		case INSERTION:
			if (result.get() == 0) {
				result = unique_ptr<vector<size_t> >(new vector<size_t>());
			}
			result->push_back(event.variation_index);
			break;
		case DELETION_START:
			active_variations.insert(event.variation_index);
			break;
		case DELETION_END:
			if (active_variations.find(event.variation_index) != active_variations.end()) {
				if (result.get() == 0) {
					result = unique_ptr<vector<size_t> >(new vector<size_t>());
				}
				result->push_back(event.variation_index);
			}
			break;
		default:
			assert(false);
			break;
		}
	}
	return result;
}